

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::populateFloatingArgs
          (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  long *plVar1;
  pointer pTVar2;
  long lVar3;
  ulong uVar4;
  
  if ((this->m_floatingArg)._M_t.
      super___uniq_ptr_impl<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
      .super__Head_base<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_false>.
      _M_head_impl == (Arg *)0x0) {
    std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::vector
              (__return_storage_ptr__,tokens);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar2 = (tokens->
             super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((tokens->
        super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
        )._M_impl.super__Vector_impl_data._M_finish != pTVar2) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        if (*(int *)((long)&pTVar2->type + lVar3) == 0) {
          plVar1 = *(long **)&(((this->m_floatingArg)._M_t.
                                super___uniq_ptr_impl<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::default_delete<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                                .
                                super__Head_base<0UL,_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_false>
                               ._M_head_impl)->super_CommonArgProperties<Catch::ConfigData>).
                              boundField;
          (**(code **)(*plVar1 + 0x10))
                    (plVar1,config,(long)&(pTVar2->data)._M_dataplus._M_p + lVar3);
        }
        else {
          std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
          push_back(__return_storage_ptr__,(value_type *)((long)&pTVar2->type + lVar3));
        }
        uVar4 = uVar4 + 1;
        pTVar2 = (tokens->
                 super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar3 = lVar3 + 0x28;
      } while (uVar4 < (ulong)(((long)(tokens->
                                      super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >>
                               3) * -0x3333333333333333));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Parser::Token> populateFloatingArgs( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            if( !m_floatingArg.get() )
                return tokens;
            std::vector<Parser::Token> unusedTokens;
            for( std::size_t i = 0; i < tokens.size(); ++i ) {
                Parser::Token const& token = tokens[i];
                if( token.type == Parser::Token::Positional )
                    m_floatingArg->boundField.set( config, token.data );
                else
                    unusedTokens.push_back( token );
            }
            return unusedTokens;
        }